

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bisstemeqcaselessblk(bstring b0,void *blk,int len)

{
  uint local_3c;
  uint local_34;
  uchar *local_30;
  int local_28;
  int i;
  int len_local;
  void *blk_local;
  bstring b0_local;
  
  if ((b0 == (bstring)0x0) || (b0->data == (uchar *)0x0)) {
    local_30 = (uchar *)0x0;
  }
  else {
    local_30 = b0->data;
  }
  if ((((local_30 == (uchar *)0x0) || (b0->slen < 0)) || (blk == (void *)0x0)) || (len < 0)) {
    b0_local._4_4_ = -1;
  }
  else if (b0->slen < len) {
    b0_local._4_4_ = 0;
  }
  else if ((b0->data == (uchar *)blk) || (len == 0)) {
    b0_local._4_4_ = 1;
  }
  else {
    for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
      if (b0->data[local_28] != *(uchar *)((long)blk + (long)local_28)) {
        if (b0->data[local_28] < 0x80) {
          local_34 = tolower((uint)b0->data[local_28]);
        }
        else {
          local_34 = (uint)b0->data[local_28];
        }
        if (*(byte *)((long)blk + (long)local_28) < 0x80) {
          local_3c = tolower((uint)*(byte *)((long)blk + (long)local_28));
        }
        else {
          local_3c = (uint)*(byte *)((long)blk + (long)local_28);
        }
        if (local_34 != local_3c) {
          return 0;
        }
      }
    }
    b0_local._4_4_ = 1;
  }
  return b0_local._4_4_;
}

Assistant:

int bisstemeqcaselessblk (const bstring b0, const void * blk, int len) {
int i;

	if (bdata (b0) == NULL || b0->slen < 0 || NULL == blk || len < 0)
		return BSTR_ERR;
	if (b0->slen < len) return 0;
	if (b0->data == (const unsigned char *) blk || len == 0) return 1;

	for (i = 0; i < len; i ++) {
		if (b0->data[i] != ((const unsigned char *) blk)[i]) {
			if (downcase (b0->data[i]) != 
			    downcase (((const unsigned char *) blk)[i])) return 0;
		}
	}
	return 1;
}